

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureGatherTests.cpp
# Opt level: O0

GLvoid __thiscall
gl4cts::anon_unknown_0::GatherBase::CreateTextureCubeArrayInt
          (GatherBase *this,int slices,int data_slice)

{
  int internalformat;
  reference pixels_00;
  int local_bc;
  undefined1 local_b8 [4];
  int i_1;
  IVec4 data [4];
  int local_70;
  int j;
  allocator<tcu::Vector<int,_4>_> local_59;
  Vector<int,_4> local_58;
  undefined1 local_48 [8];
  vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> pixels;
  int local_28;
  int i;
  GLint size;
  GLint csize;
  GLenum format;
  GLenum internal_format;
  int data_slice_local;
  int slices_local;
  GatherBase *this_local;
  
  internalformat = (*(this->super_TGBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x21])()
  ;
  local_28 = 0x20;
  glu::CallLogWrapper::glGenTextures
            (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,1,
             &this->tex);
  glu::CallLogWrapper::glBindTexture
            (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0x9009,
             this->tex);
  pixels.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  for (; 0 < local_28; local_28 = local_28 / 2) {
    glu::CallLogWrapper::glTexImage3D
              (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0x9009,
               pixels.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_,internalformat,local_28,
               local_28,slices * 6,0,0x8d99,0x1404,(void *)0x0);
    pixels.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._4_4_ =
         pixels.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
  }
  tcu::Vector<int,_4>::Vector(&local_58,999);
  std::allocator<tcu::Vector<int,_4>_>::allocator(&local_59);
  std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::vector
            ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)local_48,0x400,
             &local_58,&local_59);
  std::allocator<tcu::Vector<int,_4>_>::~allocator(&local_59);
  for (local_70 = 0; SBORROW4(local_70,slices * 6) != local_70 + slices * -6 < 0;
      local_70 = local_70 + 1) {
    pixels_00 = std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::operator[]
                          ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)
                           local_48,0);
    glu::CallLogWrapper::glTexSubImage3D
              (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0x9009,0
               ,0,0,local_70,0x20,0x20,1,0x8d99,0x1404,pixels_00);
  }
  tcu::Vector<int,_4>::Vector((Vector<int,_4> *)local_b8,0xc,0xd,0xe,0xf);
  tcu::Vector<int,_4>::Vector((Vector<int,_4> *)(data[0].m_data + 2),8,9,10,0xb);
  tcu::Vector<int,_4>::Vector((Vector<int,_4> *)(data[1].m_data + 2),0,1,2,3);
  tcu::Vector<int,_4>::Vector((Vector<int,_4> *)(data[2].m_data + 2),4,5,6,7);
  for (local_bc = 0; local_bc < 6; local_bc = local_bc + 1) {
    glu::CallLogWrapper::glTexSubImage3D
              (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0x9009,0
               ,0x16,0x19,local_bc + data_slice * 6,2,2,1,0x8d99,0x1404,local_b8);
    glu::CallLogWrapper::glTexSubImage3D
              (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0x9009,0
               ,9,0xe,local_bc + data_slice * 6,1,1,1,0x8d99,0x1404,data[2].m_data + 2);
    glu::CallLogWrapper::glTexSubImage3D
              (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0x9009,0
               ,0x10,10,local_bc + data_slice * 6,1,1,1,0x8d99,0x1404,local_b8);
    glu::CallLogWrapper::glTexSubImage3D
              (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0x9009,0
               ,0xb,2,local_bc + data_slice * 6,1,1,1,0x8d99,0x1404,data[0].m_data + 2);
    glu::CallLogWrapper::glTexSubImage3D
              (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0x9009,0
               ,0x18,0xd,local_bc + data_slice * 6,1,1,1,0x8d99,0x1404,data[1].m_data + 2);
  }
  glu::CallLogWrapper::glTexParameteri
            (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0x9009,
             0x2802,0x812f);
  glu::CallLogWrapper::glTexParameteri
            (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0x9009,
             0x2803,0x812f);
  glu::CallLogWrapper::glTexParameteri
            (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0x9009,
             0x8072,0x812f);
  glu::CallLogWrapper::glTexParameteri
            (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0x9009,
             0x2801,0x2600);
  glu::CallLogWrapper::glTexParameteri
            (&(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper,0x9009,
             0x2800,0x2600);
  std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::~vector
            ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)local_48);
  return;
}

Assistant:

virtual GLvoid CreateTextureCubeArrayInt(int slices, int data_slice)
	{
		GLenum		internal_format = InternalFormat();
		GLenum		format			= GL_RGBA_INTEGER;
		const GLint csize			= 32;
		GLint		size			= csize;

		glGenTextures(1, &tex);
		glBindTexture(GL_TEXTURE_CUBE_MAP_ARRAY, tex);
		for (int i = 0; size > 0; ++i, size /= 2)
		{
			glTexImage3D(GL_TEXTURE_CUBE_MAP_ARRAY, i, internal_format, size, size, 6 * slices, 0, format, GL_INT, 0);
		}
		std::vector<IVec4> pixels(csize * csize, IVec4(999));
		for (int j = 0; j < 6 * slices; ++j)
		{
			glTexSubImage3D(GL_TEXTURE_CUBE_MAP_ARRAY, 0, 0, 0, j, csize, csize, 1, format, GL_INT, &pixels[0]);
		}

		IVec4 data[4] = { IVec4(12, 13, 14, 15), IVec4(8, 9, 10, 11), IVec4(0, 1, 2, 3), IVec4(4, 5, 6, 7) };

		for (int i = 0; i < 6; ++i)
		{
			glTexSubImage3D(GL_TEXTURE_CUBE_MAP_ARRAY, 0, 22, 25, (6 * data_slice) + i, 2, 2, 1, format, GL_INT, data);
			glTexSubImage3D(GL_TEXTURE_CUBE_MAP_ARRAY, 0, 9, 14, (6 * data_slice) + i, 1, 1, 1, format, GL_INT,
							data + 3);
			glTexSubImage3D(GL_TEXTURE_CUBE_MAP_ARRAY, 0, 16, 10, (6 * data_slice) + i, 1, 1, 1, format, GL_INT,
							data + 0);
			glTexSubImage3D(GL_TEXTURE_CUBE_MAP_ARRAY, 0, 11, 2, (6 * data_slice) + i, 1, 1, 1, format, GL_INT,
							data + 1);
			glTexSubImage3D(GL_TEXTURE_CUBE_MAP_ARRAY, 0, 24, 13, (6 * data_slice) + i, 1, 1, 1, format, GL_INT,
							data + 2);
		}

		glTexParameteri(GL_TEXTURE_CUBE_MAP_ARRAY, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
		glTexParameteri(GL_TEXTURE_CUBE_MAP_ARRAY, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);
		glTexParameteri(GL_TEXTURE_CUBE_MAP_ARRAY, GL_TEXTURE_WRAP_R, GL_CLAMP_TO_EDGE);
		glTexParameteri(GL_TEXTURE_CUBE_MAP_ARRAY, GL_TEXTURE_MIN_FILTER, GL_NEAREST);
		glTexParameteri(GL_TEXTURE_CUBE_MAP_ARRAY, GL_TEXTURE_MAG_FILTER, GL_NEAREST);
	}